

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textbox_base.cpp
# Opt level: O0

void __thiscall
cppurses::detail::Textbox_base::Textbox_base(Textbox_base *this,Glyph_string *contents)

{
  less<int> local_44;
  Optional_last_value<void> local_43;
  less<int> local_42;
  Optional_last_value<void> local_41;
  less<int> local_40;
  Optional_last_value<void> local_3f;
  less<int> local_3e;
  Optional_last_value<void> local_3d [13];
  Glyph_string local_30;
  Glyph_string *local_18;
  Glyph_string *contents_local;
  Textbox_base *this_local;
  
  local_18 = contents;
  contents_local = (Glyph_string *)this;
  Glyph_string::Glyph_string(&local_30,contents);
  Text_display::Text_display(&this->super_Text_display,&local_30);
  Glyph_string::~Glyph_string(&local_30);
  (this->super_Text_display).super_Widget._vptr_Widget = (_func_int **)&PTR__Textbox_base_0028df90;
  sig::
  Signal<void_(unsigned_long),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(unsigned_long)>,_std::mutex>
  ::Signal(&this->cursor_moved_left,local_3d,&local_3e);
  sig::
  Signal<void_(unsigned_long),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(unsigned_long)>,_std::mutex>
  ::Signal(&this->cursor_moved_right,&local_3f,&local_40);
  sig::
  Signal<void_(unsigned_long),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(unsigned_long)>,_std::mutex>
  ::Signal(&this->cursor_moved_up,&local_41,&local_42);
  sig::
  Signal<void_(unsigned_long),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(unsigned_long)>,_std::mutex>
  ::Signal(&this->cursor_moved_down,&local_43,&local_44);
  Cursor_data::enable(&(this->super_Text_display).super_Widget.cursor,true);
  return;
}

Assistant:

Textbox_base::Textbox_base(Glyph_string contents)
    : Text_display{std::move(contents)} {
    this->cursor.enable();
}